

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O0

void __thiscall getarg_tests::boolargno::test_method(boolargno *this)

{
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  bool bVar1;
  long in_FS_OFFSET;
  pair<const_char_*,_ArgsManager::Flags> pVar2;
  pair<const_char_*,_ArgsManager::Flags> bar;
  pair<const_char_*,_ArgsManager::Flags> foo;
  ArgsManager local_args;
  ArgsManager *in_stack_fffffffffffff388;
  undefined7 in_stack_fffffffffffff390;
  undefined1 in_stack_fffffffffffff397;
  undefined7 in_stack_fffffffffffff398;
  undefined1 in_stack_fffffffffffff39f;
  char (*in_stack_fffffffffffff3a0) [5];
  const_string *in_stack_fffffffffffff3b0;
  pair<const_char_*,_ArgsManager::Flags> *in_stack_fffffffffffff3b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_stack_fffffffffffff3c0;
  undefined7 in_stack_fffffffffffff3c8;
  undefined1 in_stack_fffffffffffff3cf;
  ArgsManager *in_stack_fffffffffffff3d0;
  undefined7 in_stack_fffffffffffff3d8;
  undefined1 in_stack_fffffffffffff3df;
  string *in_stack_fffffffffffff410;
  ArgsManager *in_stack_fffffffffffff418;
  ArgsManager *pAVar3;
  undefined1 *local_a70;
  const_string local_a10 [2];
  lazy_ostream local_9f0 [2];
  allocator<char> local_9c9;
  assertion_result local_9c8 [2];
  const_string local_990 [2];
  lazy_ostream local_970 [2];
  allocator<char> local_949;
  assertion_result local_948 [2];
  undefined1 local_909 [33];
  lazy_ostream local_8e8 [2];
  allocator<char> local_8c1;
  assertion_result local_8c0 [2];
  const_string local_888 [2];
  lazy_ostream local_868 [2];
  allocator<char> local_841;
  assertion_result local_840 [2];
  allocator<char> local_801;
  const_string local_800 [2];
  lazy_ostream local_7e0 [2];
  allocator<char> local_7b9;
  assertion_result local_7b8 [2];
  const_string local_780 [2];
  lazy_ostream local_760 [2];
  allocator<char> local_739;
  assertion_result local_738 [2];
  allocator<char> local_6f9;
  const_string local_6f8 [2];
  lazy_ostream local_6d8 [2];
  allocator<char> local_6b1;
  assertion_result local_6b0 [2];
  const_string local_678 [2];
  lazy_ostream local_658 [2];
  allocator<char> local_631;
  assertion_result local_630 [2];
  allocator<char> local_5f1;
  const_string local_5f0 [2];
  lazy_ostream local_5d0 [2];
  allocator<char> local_5a9;
  assertion_result local_5a8 [2];
  const_string local_570 [2];
  lazy_ostream local_550 [2];
  allocator<char> local_529;
  assertion_result local_528 [2];
  allocator<char> local_4ea [26];
  char *local_4d0;
  Flags local_4c8;
  undefined4 local_4bc;
  char *local_4b8;
  Flags local_4b0;
  undefined4 local_4a4;
  char *local_4a0;
  Flags local_498;
  char *local_490;
  Flags local_488;
  undefined1 local_2a0 [80];
  undefined1 local_250 [584];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(in_stack_fffffffffffff388);
  local_4a4 = 1;
  pVar2 = std::make_pair<char_const(&)[5],ArgsManager::Flags>
                    (in_stack_fffffffffffff3a0,
                     (Flags *)CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398));
  local_4b8 = pVar2.first;
  local_4b0 = pVar2.second;
  local_4bc = 1;
  local_490 = local_4b8;
  local_488 = local_4b0;
  pVar2 = std::make_pair<char_const(&)[5],ArgsManager::Flags>
                    (in_stack_fffffffffffff3a0,
                     (Flags *)CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398));
  local_4d0 = pVar2.first;
  local_4c8 = pVar2.second;
  local_4a0 = local_4d0;
  local_498 = local_4c8;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            (in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            (in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)in_stack_fffffffffffff388);
  __l._M_len._0_7_ = in_stack_fffffffffffff3d8;
  __l._M_array = (iterator)in_stack_fffffffffffff3d0;
  __l._M_len._7_1_ = in_stack_fffffffffffff3df;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8),__l,
           (allocator_type *)in_stack_fffffffffffff3c0);
  SetupArgs(in_stack_fffffffffffff3d0,
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8));
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398));
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)in_stack_fffffffffffff388);
  local_a70 = local_250;
  do {
    local_a70 = local_a70 + -0x28;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)in_stack_fffffffffffff388);
  } while (local_a70 != local_2a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),
             (char *)in_stack_fffffffffffff3d0,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8));
  ResetArgs(in_stack_fffffffffffff418,in_stack_fffffffffffff410);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff388);
  std::allocator<char>::~allocator(local_4ea);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8),
               (const_string *)in_stack_fffffffffffff3c0,(size_t)in_stack_fffffffffffff3b8,
               in_stack_fffffffffffff3b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),
               (char *)in_stack_fffffffffffff3d0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (string *)in_stack_fffffffffffff388,(bool)in_stack_fffffffffffff39f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (bool)in_stack_fffffffffffff397);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (basic_cstring<const_char> *)in_stack_fffffffffffff388);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    in_stack_fffffffffffff388 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_528,local_550,local_570,0x197,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff388);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff388);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff388);
    std::allocator<char>::~allocator(&local_529);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8),
               (const_string *)in_stack_fffffffffffff3c0,(size_t)in_stack_fffffffffffff3b8,
               in_stack_fffffffffffff3b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),
               (char *)in_stack_fffffffffffff3d0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (string *)in_stack_fffffffffffff388,(bool)in_stack_fffffffffffff39f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (bool)in_stack_fffffffffffff397);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (basic_cstring<const_char> *)in_stack_fffffffffffff388);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    in_stack_fffffffffffff388 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5a8,local_5d0,local_5f0,0x198,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff388);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff388);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff388);
    std::allocator<char>::~allocator(&local_5a9);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),
             (char *)in_stack_fffffffffffff3d0,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8));
  ResetArgs(in_stack_fffffffffffff418,in_stack_fffffffffffff410);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff388);
  std::allocator<char>::~allocator(&local_5f1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8),
               (const_string *)in_stack_fffffffffffff3c0,(size_t)in_stack_fffffffffffff3b8,
               in_stack_fffffffffffff3b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),
               (char *)in_stack_fffffffffffff3d0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (string *)in_stack_fffffffffffff388,(bool)in_stack_fffffffffffff39f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (bool)in_stack_fffffffffffff397);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (basic_cstring<const_char> *)in_stack_fffffffffffff388);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    in_stack_fffffffffffff388 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_630,local_658,local_678,0x19b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff388);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff388);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff388);
    std::allocator<char>::~allocator(&local_631);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8),
               (const_string *)in_stack_fffffffffffff3c0,(size_t)in_stack_fffffffffffff3b8,
               in_stack_fffffffffffff3b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),
               (char *)in_stack_fffffffffffff3d0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (string *)in_stack_fffffffffffff388,(bool)in_stack_fffffffffffff39f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (bool)in_stack_fffffffffffff397);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (basic_cstring<const_char> *)in_stack_fffffffffffff388);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    in_stack_fffffffffffff388 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6b0,local_6d8,local_6f8,0x19c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff388);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff388);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff388);
    std::allocator<char>::~allocator(&local_6b1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),
             (char *)in_stack_fffffffffffff3d0,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8));
  ResetArgs(in_stack_fffffffffffff418,in_stack_fffffffffffff410);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff388);
  std::allocator<char>::~allocator(&local_6f9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8),
               (const_string *)in_stack_fffffffffffff3c0,(size_t)in_stack_fffffffffffff3b8,
               in_stack_fffffffffffff3b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),
               (char *)in_stack_fffffffffffff3d0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (string *)in_stack_fffffffffffff388,(bool)in_stack_fffffffffffff39f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (bool)in_stack_fffffffffffff397);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (basic_cstring<const_char> *)in_stack_fffffffffffff388);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    in_stack_fffffffffffff388 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_738,local_760,local_780,0x19f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff388);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff388);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff388);
    std::allocator<char>::~allocator(&local_739);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8),
               (const_string *)in_stack_fffffffffffff3c0,(size_t)in_stack_fffffffffffff3b8,
               in_stack_fffffffffffff3b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),
               (char *)in_stack_fffffffffffff3d0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (string *)in_stack_fffffffffffff388,(bool)in_stack_fffffffffffff39f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (bool)in_stack_fffffffffffff397);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (basic_cstring<const_char> *)in_stack_fffffffffffff388);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    in_stack_fffffffffffff388 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7b8,local_7e0,local_800,0x1a0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff388);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff388);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff388);
    std::allocator<char>::~allocator(&local_7b9);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),
             (char *)in_stack_fffffffffffff3d0,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8));
  ResetArgs(in_stack_fffffffffffff418,in_stack_fffffffffffff410);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff388);
  std::allocator<char>::~allocator(&local_801);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8),
               (const_string *)in_stack_fffffffffffff3c0,(size_t)in_stack_fffffffffffff3b8,
               in_stack_fffffffffffff3b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),
               (char *)in_stack_fffffffffffff3d0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (string *)in_stack_fffffffffffff388,(bool)in_stack_fffffffffffff39f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (bool)in_stack_fffffffffffff397);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (basic_cstring<const_char> *)in_stack_fffffffffffff388);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    in_stack_fffffffffffff388 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_840,local_868,local_888,0x1a3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff388);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff388);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff388);
    std::allocator<char>::~allocator(&local_841);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8),
               (const_string *)in_stack_fffffffffffff3c0,(size_t)in_stack_fffffffffffff3b8,
               in_stack_fffffffffffff3b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),
               (char *)in_stack_fffffffffffff3d0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (string *)in_stack_fffffffffffff388,(bool)in_stack_fffffffffffff39f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (bool)in_stack_fffffffffffff397);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (basic_cstring<const_char> *)in_stack_fffffffffffff388);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    in_stack_fffffffffffff388 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8c0,local_8e8,(const_string *)(local_909 + 1),0x1a4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff388);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff388);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff388);
    std::allocator<char>::~allocator(&local_8c1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  pAVar3 = (ArgsManager *)local_909;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),
             (char *)in_stack_fffffffffffff3d0,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8));
  ResetArgs(pAVar3,in_stack_fffffffffffff410);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff388);
  std::allocator<char>::~allocator((allocator<char> *)local_909);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8),
               (const_string *)in_stack_fffffffffffff3c0,(size_t)in_stack_fffffffffffff3b8,
               in_stack_fffffffffffff3b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),
               (char *)in_stack_fffffffffffff3d0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (string *)in_stack_fffffffffffff388,(bool)in_stack_fffffffffffff39f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (bool)in_stack_fffffffffffff397);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (basic_cstring<const_char> *)in_stack_fffffffffffff388);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    in_stack_fffffffffffff388 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_948,local_970,local_990,0x1a7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff388);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff388);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff388);
    std::allocator<char>::~allocator(&local_949);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff388);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8),
               (const_string *)in_stack_fffffffffffff3c0,(size_t)in_stack_fffffffffffff3b8,
               in_stack_fffffffffffff3b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),
               (char *)in_stack_fffffffffffff3d0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff3cf,in_stack_fffffffffffff3c8));
    in_stack_fffffffffffff3df =
         ArgsManager::GetBoolArg
                   ((ArgsManager *)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
                    (string *)in_stack_fffffffffffff388,(bool)in_stack_fffffffffffff39f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (bool)in_stack_fffffffffffff397);
    in_stack_fffffffffffff3d0 = (ArgsManager *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (basic_cstring<const_char> *)in_stack_fffffffffffff388);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
               (pointer)CONCAT17(in_stack_fffffffffffff397,in_stack_fffffffffffff390),
               (unsigned_long)in_stack_fffffffffffff388);
    in_stack_fffffffffffff388 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9c8,local_9f0,local_a10,0x1a8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff388);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff388);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff388);
    std::allocator<char>::~allocator(&local_9c9);
    in_stack_fffffffffffff3cf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff3cf);
  ArgsManager::~ArgsManager(in_stack_fffffffffffff388);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(boolargno)
{
    ArgsManager local_args;

    const auto foo = std::make_pair("-foo", ArgsManager::ALLOW_ANY);
    const auto bar = std::make_pair("-bar", ArgsManager::ALLOW_ANY);
    SetupArgs(local_args, {foo, bar});
    ResetArgs(local_args, "-nofoo");
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));

    ResetArgs(local_args, "-nofoo=1");
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));

    ResetArgs(local_args, "-nofoo=0");
    BOOST_CHECK(local_args.GetBoolArg("-foo", true));
    BOOST_CHECK(local_args.GetBoolArg("-foo", false));

    ResetArgs(local_args, "-foo --nofoo"); // --nofoo should win
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));

    ResetArgs(local_args, "-nofoo -foo"); // foo always wins:
    BOOST_CHECK(local_args.GetBoolArg("-foo", true));
    BOOST_CHECK(local_args.GetBoolArg("-foo", false));
}